

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

char * fits_find_match_delim(char *string,char delim)

{
  int iVar1;
  char *tstr;
  char *local_8;
  
  if (string != (char *)0x0) {
    if (delim < ')') {
      if (delim == '\"') {
        for (; *string != '\0'; string = string + 1) {
          if (*string == '\"') goto LAB_0012d5f3;
        }
      }
      else {
        if (delim != '\'') {
          return (char *)0x0;
        }
        for (; *string != '\0'; string = string + 1) {
          if (*string == '\'') {
LAB_0012d5f3:
            return string + 1;
          }
        }
      }
    }
    else {
      local_8 = string;
      if (delim == ')') {
        iVar1 = find_paren(&local_8);
      }
      else if (delim == ']') {
        iVar1 = find_bracket(&local_8);
      }
      else {
        if (delim != '}') {
          return (char *)0x0;
        }
        iVar1 = find_curlybracket(&local_8);
      }
      if (iVar1 == 0) {
        return local_8;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *fits_find_match_delim(char *string, char delim)
/*
  Find matching delimiter, respecting quoting and (potentially nested) parentheses
  
  char *string - null-terminated string to be searched for delimiter
  char delim - single delimiter to search for (one of '")]} )

  returns: pointer to character after delimiter, or 0 if not found
*/
{
  char *tstr = string;
  int retval = 0;

  if (!string) return 0;
  switch (delim) {
  case '\'': retval = find_quote(&tstr); break;
  case '"':  retval = find_doublequote(&tstr); break;
  case '}':  retval = find_curlybracket(&tstr); break;
  case ']':  retval = find_bracket(&tstr); break;
  case ')':  retval = find_paren(&tstr); break;
  default: return 0; /* Invalid delimeter, return failure */
  }

  /* Delimeter not found, return failure */
  if (retval) return 0;

  /* Delimeter was found, return next position */
  return (tstr);
}